

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O1

CScript * BuildScript<CScript,unsigned_int_const&,opcodetype>
                    (CScript *__return_storage_ptr__,CScript *inputs,uint *inputs_1,
                    opcodetype *inputs_2)

{
  long lVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  if (0x1c < (__return_storage_ptr__->super_CScriptBase)._size) {
    free((__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect);
  }
  pcVar2 = (inputs->super_CScriptBase)._union.indirect_contents.indirect;
  uVar3 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 8);
  uVar4 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0x14);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0xc) =
       *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0xc);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x14) = uVar4;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = pcVar2;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = uVar3;
  (__return_storage_ptr__->super_CScriptBase)._size = (inputs->super_CScriptBase)._size;
  (inputs->super_CScriptBase)._size = 0;
  CScript::push_int64(__return_storage_ptr__,(ulong)*inputs_1);
  CScript::operator<<(__return_storage_ptr__,*inputs_2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}